

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

DistantLight *
pbrt::DistantLight::Create
          (Transform *renderFromLight,ParameterDictionary *parameters,RGBColorSpace *colorSpace,
          FileLoc *loc,Allocator alloc)

{
  DistantLight *pDVar1;
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  Float FVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  Point3f PVar13;
  Float sc;
  SpectrumHandle L;
  Float k_e;
  Transform t;
  Transform finalRenderFromLight;
  Float local_1a8;
  float local_1a4;
  undefined1 local_1a0 [8];
  undefined1 local_198 [16];
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  polymorphic_allocator<std::byte> local_170;
  undefined1 local_168 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [7];
  undefined1 local_c8 [16];
  SpectrumHandle local_b8;
  ulong local_b0;
  Transform local_a8;
  undefined1 auVar8 [56];
  
  local_170.memoryResource = alloc.memoryResource;
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"L","");
  local_b0 = (ulong)&colorSpace->illuminant | 0x2000000000000;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)local_1a0,(string *)parameters,
             (SpectrumHandle *)&local_148._M_allocated_capacity,(SpectrumType)&local_b0,
             (Allocator)0x1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0]._M_allocated_capacity + 1);
  }
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"scale","");
  FVar3 = ParameterDictionary::GetOneFloat(parameters,(string *)&local_148,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0]._M_allocated_capacity + 1);
  }
  auVar8 = (undefined1  [56])0x0;
  local_1a8 = FVar3;
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"from","");
  local_a8.m.m[0][0] = 0.0;
  local_a8.m.m[0][1] = 0.0;
  local_a8.m.m[0][2] = 0.0;
  PVar13 = ParameterDictionary::GetOnePoint3f(parameters,(string *)&local_148,(Point3f *)&local_a8);
  local_188 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar6._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar8;
  local_198 = auVar6._0_16_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0]._M_allocated_capacity + 1);
  }
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"to","");
  local_a8.m.m[0][0] = 0.0;
  local_a8.m.m[0][1] = 0.0;
  local_a8.m.m[0][2] = 1.0;
  PVar13 = ParameterDictionary::GetOnePoint3f(parameters,(string *)&local_148,(Point3f *)&local_a8);
  auVar7._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar8;
  auVar9 = auVar7._0_16_;
  fVar12 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != local_138) {
    local_1a4 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    local_c8 = auVar7._0_16_;
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0]._M_allocated_capacity + 1);
    auVar9 = local_c8;
    fVar12 = local_1a4;
  }
  auVar11 = vsubps_avx(local_198,auVar9);
  auVar9 = vmovshdup_avx(auVar11);
  local_a8.m.m[1][2] = auVar9._0_4_;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.m.m[1][2] * local_a8.m.m[1][2])),auVar11,auVar11)
  ;
  fVar12 = (float)local_188 - fVar12;
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
  auVar2 = vsqrtss_avx(auVar2,auVar2);
  local_a8.m.m[0][2] = auVar2._0_4_;
  auVar10._0_4_ = fVar12 / local_a8.m.m[0][2];
  auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
  local_a8.m.m[1][2] = local_a8.m.m[1][2] / local_a8.m.m[0][2];
  local_a8.m.m[0][2] = auVar11._0_4_ / local_a8.m.m[0][2];
  auVar11._8_4_ = 0x3f800000;
  auVar11._0_8_ = 0x3f8000003f800000;
  auVar11._12_4_ = 0x3f800000;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vpternlogd_avx512vl(auVar11,auVar10,auVar2,0xf8);
  local_a8.m.m[1][0] = auVar2._0_4_;
  local_a8.m.m[2][1] = -local_a8.m.m[1][2];
  local_188 = -local_a8.m.m[1][2];
  uStack_184 = auVar9._4_4_ ^ 0x80000000;
  uStack_180 = auVar9._8_4_ ^ 0x80000000;
  uStack_17c = auVar9._12_4_ ^ 0x80000000;
  local_a8.m.m[2][0] = -local_a8.m.m[1][0] * local_a8.m.m[0][2];
  fVar12 = -1.0 / (auVar10._0_4_ + local_a8.m.m[1][0]);
  local_a8.m.m[0][1] = local_a8.m.m[0][2] * local_a8.m.m[1][2] * fVar12;
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)(local_a8.m.m[0][2] * local_a8.m.m[1][0] *
                                         local_a8.m.m[0][2])),ZEXT416((uint)fVar12),auVar11);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)(local_a8.m.m[1][2] * local_a8.m.m[1][2])),
                           ZEXT416((uint)fVar12),auVar2);
  local_a8.m.m[1][0] = local_a8.m.m[1][0] * local_a8.m.m[0][1];
  local_a8.m.m[0][0] = auVar9._0_4_;
  local_a8.m.m._44_16_ = ZEXT816(0) << 0x20;
  local_a8.m.m[0][3] = 0.0;
  local_a8.m.m[1][1] = auVar2._0_4_;
  local_a8.m.m[1][3] = 0.0;
  local_a8.m.m[3][3] = 1.0;
  local_a8.m.m[2][2] = auVar10._0_4_;
  Transform::Transform((Transform *)&local_148,&local_a8.m);
  Transform::operator*(&local_a8,renderFromLight,(Transform *)&local_148);
  local_b8.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )local_1a0;
  FVar4 = SpectrumToPhotometric(&local_b8);
  local_1a8 = FVar3 / FVar4;
  local_168._0_8_ = (ParsedParameter *)(local_168 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"illuminance","");
  FVar5 = ParameterDictionary::GetOneFloat(parameters,(string *)local_168,-1.0);
  if ((ParsedParameter *)local_168._0_8_ != (ParsedParameter *)(local_168 + 0x10)) {
    local_198._0_4_ = FVar5;
    operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    FVar5 = (Float)local_198._0_4_;
  }
  if (0.0 < FVar5) {
    local_1a8 = (FVar5 / (float)local_188) * (FVar3 / FVar4);
  }
  pDVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DistantLight,pbrt::Transform&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&local_170,&local_a8,(SpectrumHandle *)local_1a0,&local_1a8,&local_170);
  return pDVar1;
}

Assistant:

DistantLight *DistantLight::Create(const Transform &renderFromLight,
                                   const ParameterDictionary &parameters,
                                   const RGBColorSpace *colorSpace, const FileLoc *loc,
                                   Allocator alloc) {
    SpectrumHandle L = parameters.GetOneSpectrum("L", &colorSpace->illuminant,
                                                 SpectrumType::General, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Point3f from = parameters.GetOnePoint3f("from", Point3f(0, 0, 0));
    Point3f to = parameters.GetOnePoint3f("to", Point3f(0, 0, 1));

    Vector3f w = Normalize(from - to);
    Vector3f v1, v2;
    CoordinateSystem(w, &v1, &v2);
    Float m[4][4] = {v1.x, v2.x, w.x, 0, v1.y, v2.y, w.y, 0,
                     v1.z, v2.z, w.z, 0, 0,    0,    0,   1};
    Transform t(m);
    Transform finalRenderFromLight = renderFromLight * t;

    // Scale the light spectrum to be equivalent to 1 nit
    sc /= SpectrumToPhotometric(L);

    // Adjust scale to meet target illuminance value
    // Like for IBLs we measure illuminance as incident on an upward-facing
    // patch.
    Float E_v = parameters.GetOneFloat("illuminance", -1);
    if (E_v > 0) {
        Float k_e = -w.y;
        sc *= E_v / k_e;
    }

    return alloc.new_object<DistantLight>(finalRenderFromLight, L, sc, alloc);
}